

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O2

string * __thiscall
anon_unknown.dwarf_eeb9ab::cmDirectoryListGenerator::GetNextCandidate
          (string *__return_storage_ptr__,cmDirectoryListGenerator *this,string *parent)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar1;
  pointer pbVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  bool bVar3;
  int iVar4;
  unsigned_long uVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  pointer pbVar7;
  ulong dindex;
  Directory directoryLister;
  char *fname;
  string name;
  Directory DStack_98;
  char *local_90;
  string *local_88;
  string *local_80;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_78;
  string local_70;
  undefined7 uStack_6f;
  size_t local_68;
  string local_50 [32];
  
  pbVar6 = (this->Matches).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if ((this->Matches).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start == pbVar6) {
    local_80 = __return_storage_ptr__;
    cmsys::Directory::Directory(&DStack_98);
    local_88 = parent;
    cmsys::Directory::Load(&DStack_98,parent,(string *)0x0);
    local_78 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&this->Matches;
    dindex = 0;
    while( true ) {
      uVar5 = cmsys::Directory::GetNumberOfFiles(&DStack_98);
      if (uVar5 <= dindex) break;
      local_90 = cmsys::Directory::GetFile(&DStack_98,dindex);
      bVar3 = isDirentryToIgnore(local_90);
      if (!bVar3) {
        pvVar1 = (this->Names)._M_data;
        pbVar2 = (pvVar1->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        for (pbVar7 = (pvVar1->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start; pbVar7 != pbVar2;
            pbVar7 = pbVar7 + 1) {
          std::__cxx11::string::string(local_50,(string *)pbVar7);
          (*this->_vptr_cmDirectoryListGenerator[3])(&local_70,this,local_50);
          std::__cxx11::string::~string(local_50);
          iVar4 = cmsysString_strncasecmp(local_90,(char *)CONCAT71(uStack_6f,local_70),local_68);
          if (iVar4 == 0) {
            bVar3 = cmsys::Directory::FileIsDirectory(&DStack_98,dindex);
            if (bVar3) {
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<char_const*const&>(local_78,&local_90);
            }
          }
          std::__cxx11::string::~string(&local_70);
        }
      }
      dindex = dindex + 1;
    }
    (*this->_vptr_cmDirectoryListGenerator[2])(this);
    (this->Current)._M_current =
         (this->Matches).
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    cmsys::Directory::~Directory(&DStack_98);
    pbVar6 = (this->Matches).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    __return_storage_ptr__ = local_80;
    parent = local_88;
  }
  args = (this->Current)._M_current;
  if (args == pbVar6) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    local_70 = (string)0x2f;
    (this->Current)._M_current = args + 1;
    cmStrCat<std::__cxx11::string_const&,char,std::__cxx11::string_const&>
              (__return_storage_ptr__,parent,(char *)&local_70,args);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GetNextCandidate(const std::string& parent)
  {
    // Construct a list of matches if not yet
    if (this->Matches.empty()) {
      cmsys::Directory directoryLister;
      // ALERT `Directory::Load()` keeps only names
      // internally and LOST entry type from `dirent`.
      // So, `Directory::FileIsDirectory` gonna use
      // `SystemTools::FileIsDirectory()` and waste a syscall.
      // TODO Need to enhance the `Directory` class.
      directoryLister.Load(parent);

      // ATTENTION Is it guaranteed that first two entries are
      // `.` and `..`?
      // TODO If so, just start with index 2 and drop the
      // `isDirentryToIgnore(i)` condition to check.
      for (auto i = 0ul; i < directoryLister.GetNumberOfFiles(); ++i) {
        const char* const fname = directoryLister.GetFile(i);
        if (isDirentryToIgnore(fname)) {
          continue;
        }

        for (const auto& n : this->Names.get()) {
          // NOTE Customization point for `cmMacProjectDirectoryListGenerator`
          const auto name = this->TransformNameBeforeCmp(n);
          // Skip entries that don't match and non-directories.
          // ATTENTION BTW, original code also didn't check if it's a symlink
          // to a directory!
          const auto equal =
            (cmsysString_strncasecmp(fname, name.c_str(), name.length()) == 0);
          if (equal && directoryLister.FileIsDirectory(i)) {
            this->Matches.emplace_back(fname);
          }
        }
      }
      // NOTE Customization point for `cmProjectDirectoryListGenerator`
      this->OnMatchesLoaded();

      this->Current = this->Matches.cbegin();
    }

    if (this->Current != this->Matches.cend()) {
      auto candidate = cmStrCat(parent, '/', *this->Current++);
      return candidate;
    }

    return {};
  }